

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionUtilsBullet.cpp
# Opt level: O2

bool chrono::collision::bt_utils::IntersectSegmentCylinder
               (cbtVector3 *sC,cbtVector3 *sD,cbtScalar sH,cbtVector3 *cC,cbtVector3 *cD,
               cbtScalar cH,cbtScalar cR,cbtScalar tol,cbtScalar *tMin,cbtScalar *tMax)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  cbtScalar cVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  ulong uVar42;
  undefined1 in_register_00001244 [60];
  undefined1 auVar43 [56];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  float fVar44;
  float fVar45;
  cbtVector3 cVar46;
  cbtScalar t2;
  cbtScalar t1;
  cbtScalar vcD;
  cbtScalar local_c0;
  cbtScalar local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  cbtScalar local_94;
  cbtScalar local_90;
  cbtScalar local_8c;
  undefined1 local_88 [16];
  cbtVector3 local_78;
  cbtVector3 local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 extraout_var [60];
  undefined1 auVar29 [56];
  
  auVar43 = in_register_00001244._4_56_;
  auVar15._4_60_ = in_register_00001204;
  auVar15._0_4_ = sH;
  auVar29 = in_register_00001204._4_56_;
  *tMin = -1e+18;
  local_88._0_4_ = tol;
  local_58 = auVar15._0_16_;
  *tMax = 1e+18;
  local_c0 = cH;
  local_bc = cR;
  cVar46 = ::operator-(sC,cC);
  auVar30._0_8_ = cVar46.m_floats._8_8_;
  auVar30._8_56_ = auVar43;
  auVar16._0_8_ = cVar46.m_floats._0_8_;
  auVar16._8_56_ = auVar29;
  local_a8 = auVar16._0_16_;
  local_48 = vmovshdup_avx(local_a8);
  local_b8 = auVar30._0_16_;
  auVar17._0_4_ = cbtVector3::dot(cD,sD);
  auVar17._4_60_ = extraout_var;
  auVar14 = auVar17._0_16_;
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)((float)local_48._0_4_ * cD->m_floats[1])),local_a8,
                            ZEXT416((uint)cD->m_floats[0]));
  auVar10 = vfmadd231ss_fma(auVar10,local_b8,ZEXT416((uint)cD->m_floats[2]));
  auVar29 = ZEXT856(auVar10._8_8_);
  auVar2 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar14,auVar14);
  auVar9._8_4_ = 0x7fffffff;
  auVar9._0_8_ = 0x7fffffff7fffffff;
  auVar9._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx512vl(auVar2,auVar9);
  auVar43 = ZEXT856(auVar9._8_8_);
  local_8c = auVar10._0_4_;
  if ((float)local_88._0_4_ <= auVar9._0_4_) {
    auVar11._8_4_ = 0x80000000;
    auVar11._0_8_ = 0x8000000080000000;
    auVar11._12_4_ = 0x80000000;
    auVar11 = vxorps_avx512vl(auVar10,auVar11);
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)((float)local_48._0_4_ * sD->m_floats[1])),local_a8,
                             ZEXT416((uint)sD->m_floats[0]));
    auVar9 = vfmadd231ss_fma(auVar9,local_b8,ZEXT416((uint)sD->m_floats[2]));
    auVar14 = vfnmadd213ss_fma(auVar14,auVar10,auVar9);
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)((float)local_48._0_4_ * (float)local_48._0_4_)),local_a8
                             ,local_a8);
    auVar9 = vfmadd231ss_fma(auVar9,local_b8,local_b8);
    auVar10 = vfmadd231ss_fma(auVar9,auVar10,auVar11);
    auVar10 = vfnmadd213ss_fma(ZEXT416((uint)local_bc),ZEXT416((uint)local_bc),auVar10);
    auVar10 = vfmsub231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar2._0_4_)),auVar14,auVar14);
    fVar13 = auVar10._0_4_;
    if (fVar13 < 0.0) {
      return false;
    }
    if (fVar13 < 0.0) {
      local_b8 = auVar14;
      local_a8 = auVar2;
      fVar13 = sqrtf(fVar13);
      auVar14 = local_b8;
      auVar2 = local_a8;
    }
    else {
      auVar10 = vsqrtss_avx(auVar10,auVar10);
      fVar13 = auVar10._0_4_;
    }
    auVar10._8_4_ = 0x80000000;
    auVar10._0_8_ = 0x8000000080000000;
    auVar10._12_4_ = 0x80000000;
    auVar10 = vxorps_avx512vl(auVar14,auVar10);
    uVar42 = 0;
    auVar14._0_4_ = (fVar13 - auVar14._0_4_) / auVar2._0_4_;
    auVar14._4_12_ = SUB6012((undefined1  [60])0x0,0);
    *tMin = (auVar10._0_4_ - fVar13) / auVar2._0_4_;
  }
  else {
    cVar46 = ::operator*(cD,&local_8c);
    auVar31._0_8_ = cVar46.m_floats._8_8_;
    auVar31._8_56_ = auVar43;
    auVar18._0_8_ = cVar46.m_floats._0_8_;
    auVar18._8_56_ = auVar29;
    auVar10 = vsubps_avx(local_a8,auVar18._0_16_);
    auVar2 = vsubps_avx(local_b8,auVar31._0_16_);
    local_68.m_floats = (cbtScalar  [4])vinsertps_avx(auVar10,auVar2,0x28);
    cVar12 = cbtVector3::length2(&local_68);
    if (local_bc * local_bc < cVar12) {
      return false;
    }
    uVar42 = local_58._8_8_;
    auVar2._8_4_ = 0x80000000;
    auVar2._0_8_ = 0x8000000080000000;
    auVar2._12_4_ = 0x80000000;
    auVar10 = vxorps_avx512vl(local_58,auVar2);
    *tMin = auVar10._0_4_;
    auVar14 = local_58;
  }
  local_b8._0_8_ = tMin;
  auVar43 = ZEXT856(uVar42);
  auVar29 = ZEXT856(auVar14._8_8_);
  local_a8._0_8_ = tMax;
  *tMax = auVar14._0_4_;
  cVar46 = ::operator*(cD,&local_c0);
  auVar32._0_8_ = cVar46.m_floats._8_8_;
  auVar32._8_56_ = auVar43;
  auVar19._0_8_ = cVar46.m_floats._0_8_;
  auVar19._8_56_ = auVar29;
  local_78.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar19._0_16_,auVar32._0_16_);
  auVar29 = ZEXT856(local_78.m_floats._8_8_);
  cVar46 = ::operator+(cC,&local_78);
  auVar33._0_8_ = cVar46.m_floats._8_8_;
  auVar33._8_56_ = auVar43;
  auVar20._0_8_ = cVar46.m_floats._0_8_;
  auVar20._8_56_ = auVar29;
  local_68.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar20._0_16_,auVar33._0_16_);
  auVar29 = (undefined1  [56])0x0;
  bVar6 = IntersectLinePlane(sC,sD,&local_68,cD,(cbtScalar)local_88._0_4_,&local_90);
  cVar46 = ::operator*(cD,&local_c0);
  auVar34._0_8_ = cVar46.m_floats._8_8_;
  auVar34._8_56_ = auVar43;
  auVar21._0_8_ = cVar46.m_floats._0_8_;
  auVar21._8_56_ = auVar29;
  local_78.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar21._0_16_,auVar34._0_16_);
  auVar29 = ZEXT856(local_78.m_floats._8_8_);
  cVar46 = ::operator-(cC,&local_78);
  auVar35._0_8_ = cVar46.m_floats._8_8_;
  auVar35._8_56_ = auVar43;
  auVar22._0_8_ = cVar46.m_floats._0_8_;
  auVar22._8_56_ = auVar29;
  local_68.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar22._0_16_,auVar35._0_16_);
  auVar29 = (undefined1  [56])0x0;
  bVar7 = IntersectLinePlane(sC,sD,&local_68,cD,(cbtScalar)local_88._0_4_,&local_94);
  if (bVar6 != bVar7) {
    __assert_fail("code1 == code2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/ChCollisionUtilsBullet.cpp"
                  ,0x11b,
                  "bool chrono::collision::bt_utils::IntersectSegmentCylinder(const cbtVector3 &, const cbtVector3 &, const cbtScalar, const cbtVector3 &, const cbtVector3 &, const cbtScalar, const cbtScalar, const cbtScalar, cbtScalar &, cbtScalar &)"
                 );
  }
  if (bVar6 && bVar7) {
    auVar2 = vminss_avx(ZEXT416((uint)local_90),ZEXT416((uint)local_94));
    auVar10 = vmaxss_avx(ZEXT416((uint)local_94),ZEXT416((uint)local_90));
    auVar2 = vmaxss_avx(ZEXT416((uint)*(float *)local_b8._0_8_),auVar2);
    *(float *)local_b8._0_8_ = auVar2._0_4_;
    auVar10 = vminss_avx(ZEXT416((uint)*(float *)local_a8._0_8_),auVar10);
    fVar13 = auVar10._0_4_;
    *(float *)local_a8._0_8_ = fVar13;
    fVar8 = *(float *)local_b8._0_8_;
    if (fVar13 < fVar8) {
      return false;
    }
  }
  else {
    cVar46 = ::operator*(cD,&local_c0);
    auVar36._0_8_ = cVar46.m_floats._8_8_;
    auVar36._8_56_ = auVar43;
    auVar23._0_8_ = cVar46.m_floats._0_8_;
    auVar23._8_56_ = auVar29;
    local_78.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar23._0_16_,auVar36._0_16_);
    auVar29 = ZEXT856(local_78.m_floats._8_8_);
    cVar46 = ::operator+(cC,&local_78);
    auVar37._0_8_ = cVar46.m_floats._8_8_;
    auVar37._8_56_ = auVar43;
    auVar24._0_8_ = cVar46.m_floats._0_8_;
    auVar24._8_56_ = auVar29;
    local_68.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar24._0_16_,auVar37._0_16_);
    auVar29 = ZEXT856(local_68.m_floats._8_8_);
    cVar46 = ::operator-(&local_68,sC);
    auVar38._0_8_ = cVar46.m_floats._8_8_;
    auVar38._8_56_ = auVar43;
    auVar25._0_8_ = cVar46.m_floats._0_8_;
    auVar25._8_56_ = auVar29;
    auVar10 = vmovshdup_avx(auVar25._0_16_);
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * cD->m_floats[1])),auVar25._0_16_,
                              ZEXT416((uint)cD->m_floats[0]));
    auVar10 = vfmadd132ss_fma(auVar38._0_16_,auVar10,ZEXT416((uint)cD->m_floats[2]));
    auVar43 = ZEXT856(auVar10._8_8_);
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    local_88 = vandps_avx512vl(auVar10,auVar4);
    auVar29 = ZEXT856(local_88._8_8_);
    cVar46 = ::operator*(cD,&local_c0);
    auVar39._0_8_ = cVar46.m_floats._8_8_;
    auVar39._8_56_ = auVar43;
    auVar26._0_8_ = cVar46.m_floats._0_8_;
    auVar26._8_56_ = auVar29;
    local_78.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar26._0_16_,auVar39._0_16_);
    auVar29 = ZEXT856(local_78.m_floats._8_8_);
    cVar46 = ::operator-(cC,&local_78);
    auVar40._0_8_ = cVar46.m_floats._8_8_;
    auVar40._8_56_ = auVar43;
    auVar27._0_8_ = cVar46.m_floats._0_8_;
    auVar27._8_56_ = auVar29;
    local_68.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar27._0_16_,auVar40._0_16_);
    auVar29 = ZEXT856(local_68.m_floats._8_8_);
    cVar46 = ::operator-(&local_68,sC);
    auVar41._0_8_ = cVar46.m_floats._8_8_;
    auVar41._8_56_ = auVar43;
    auVar28._0_8_ = cVar46.m_floats._0_8_;
    auVar28._8_56_ = auVar29;
    if (local_c0 + local_c0 < (float)local_88._0_4_) {
      return false;
    }
    auVar10 = vmovshdup_avx(auVar28._0_16_);
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * cD->m_floats[1])),auVar28._0_16_,
                              ZEXT416((uint)cD->m_floats[0]));
    auVar10 = vfmadd132ss_fma(auVar41._0_16_,auVar10,ZEXT416((uint)cD->m_floats[2]));
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar10 = vandps_avx512vl(auVar10,auVar5);
    if (local_c0 + local_c0 < auVar10._0_4_) {
      return false;
    }
    fVar8 = *(float *)local_b8._0_8_;
    fVar13 = *(float *)local_a8._0_8_;
  }
  auVar3._8_4_ = 0x80000000;
  auVar3._0_8_ = 0x8000000080000000;
  auVar3._12_4_ = 0x80000000;
  auVar10 = vxorps_avx512vl(local_58,auVar3);
  fVar44 = auVar10._0_4_;
  if (((fVar8 < fVar44) && (fVar13 < fVar44)) ||
     ((fVar45 = local_58._0_4_, fVar45 < fVar8 && (fVar45 < fVar13)))) {
    return false;
  }
  if ((fVar8 < fVar44) || (fVar45 < fVar8)) {
    uVar1 = vcmpss_avx512f(ZEXT416((uint)fVar8),auVar10,1);
    bVar6 = (bool)((byte)uVar1 & 1);
    fVar8 = (float)((uint)bVar6 * (int)fVar44 + (uint)!bVar6 * (int)fVar45);
    *(float *)local_b8._0_8_ = fVar8;
    fVar13 = *(float *)local_a8._0_8_;
  }
  if ((fVar13 < fVar44) || (auVar10 = local_58, fVar45 < fVar13)) {
    fVar13 = auVar10._0_4_;
    *(float *)local_a8._0_8_ = fVar13;
    fVar8 = *(float *)local_b8._0_8_;
  }
  if (fVar13 < fVar8) {
    __assert_fail("tMin <= tMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/ChCollisionUtilsBullet.cpp"
                  ,0x137,
                  "bool chrono::collision::bt_utils::IntersectSegmentCylinder(const cbtVector3 &, const cbtVector3 &, const cbtScalar, const cbtVector3 &, const cbtVector3 &, const cbtScalar, const cbtScalar, const cbtScalar, cbtScalar &, cbtScalar &)"
                 );
  }
  return true;
}

Assistant:

bool IntersectSegmentCylinder(const cbtVector3& sC,  // segment center point
                              const cbtVector3& sD,  // segment direction (unit vector)
                              const cbtScalar sH,    // segment half-length
                              const cbtVector3& cC,  // cylinder axis center
                              const cbtVector3& cD,  // cylinder axis direction (unit vector)
                              const cbtScalar cH,    // cylinder axis half-length (cylinder halh-height)
                              const cbtScalar cR,    // cylinder radius
                              const cbtScalar tol,   // tolerance for parallelism test
                              cbtScalar& tMin,       // segment parameter of first intersection point
                              cbtScalar& tMax        // segment parameter of second intersection point
) {
    tMin = -BT_LARGE_FLOAT;
    tMax = +BT_LARGE_FLOAT;

    cbtVector3 v = sC - cC;
    cbtScalar cDsD = cD.dot(sD);
    cbtScalar vcD = v.dot(cD);
    cbtScalar vsD = v.dot(sD);
    cbtScalar vv = v.dot(v);
    cbtScalar a = 1 - cDsD * cDsD;
    cbtScalar b = vsD - vcD * cDsD;
    cbtScalar c = vv - vcD * vcD - cR * cR;

    // Intersection with cylindrical surface.
    // a >= 0 always
    // a == 0 indicates line parallel to cylinder axis
    if (std::abs(a) < tol) {
        // line parallel to cylinder axis
        cbtScalar dist2 = (v - vcD * cD).length2();
        if (dist2 > cR * cR)
            return false;
        tMin = -sH;
        tMax = +sH;
    } else {
        // line intersects cylindrical surface
        cbtScalar discr = b * b - a * c;
        if (discr < 0)
            return false;  // no real roots, no intersection
        discr = cbtSqrt(discr);
        tMin = (-b - discr) / a;
        tMax = (-b + discr) / a;
    }

    // Intersection with end-caps.
    cbtScalar t1;
    bool code1 = IntersectLinePlane(sC, sD, cC + cH * cD, cD, tol, t1);
    cbtScalar t2;
    bool code2 = IntersectLinePlane(sC, sD, cC - cH * cD, cD, tol, t2);
    assert(code1 == code2);
    if (code1 && code2) {
        // line intersects end-caps
        if (t1 < t2) {
            tMin = cbtMax(tMin, t1);
            tMax = cbtMin(tMax, t2);
        } else {
            tMin = cbtMax(tMin, t2);
            tMax = cbtMin(tMax, t1);
        }
        if (tMax < tMin)
            return false;
    } else {
        // line parallel to end-cap planes
        cbtScalar d1 = std::abs(cD.dot(cC + cH * cD - sC));
        cbtScalar d2 = std::abs(cD.dot(cC - cH * cD - sC));
        if (d1 > 2 * cH || d2 > 2 * cH)
            return false;
    }

    // If both intersection points are outside the segment, no intersection
    if ((tMin < -sH && tMax < -sH) || (tMin > +sH && tMax > +sH))
        return false;

    // Clamp to segment length
    cbtClamp(tMin, -sH, +sH);
    cbtClamp(tMax, -sH, +sH);

    assert(tMin <= tMax);

    return true;
}